

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O0

bool __thiscall
CMeshClosestPointMapper::AdaptedMatchFaceTC
          (CMeshClosestPointMapper *this,int count,ON_3dPoint *pPts,SamplePoint *pSamplePts,
          int tcCount,ON_3dPoint *pTcsOut,double mappingTol,bool bEqualFaceCheck,
          TcSeamlessPatchCache *patchCache)

{
  ON_Mesh *mesh;
  ON_2fPointArray *tcs;
  ON_3dVector delta;
  bool bVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  ON_3dPoint *pOVar5;
  ON_3dPoint *pOVar6;
  TcSeamlessPatch *this_00;
  ON_BoundingBox *pOVar7;
  ON_3dVector local_1d0;
  undefined1 auStack_1b8 [8];
  ON_BoundingBox patchMaxDistBb;
  TcSeamlessPatch *sp_1;
  double dStack_170;
  int i_4;
  double maxDist_1;
  TcSeamlessPatch *pTStack_160;
  bool bSuccess_1;
  TcSeamlessPatch *sp;
  double dStack_150;
  int i_3;
  double maxDist;
  int local_140;
  int iStack_13c;
  bool bSuccess;
  int pi;
  double tol;
  undefined1 local_128 [4];
  int i_2;
  ON_3dPointArray bestTcs;
  double bestTol;
  int i_1;
  int i;
  ON_SimpleArray<int> newCommonFis;
  ON_RTreeSphere sphere;
  int local_b4;
  undefined1 local_b0 [4];
  int fvi;
  ON_SimpleArray<int> allFis;
  ON_SimpleArray<int> commonFis;
  ON_BoundingBox samplePointBbox;
  bool bEqualFaceCheck_local;
  double mappingTol_local;
  ON_3dPoint *pTcsOut_local;
  int tcCount_local;
  SamplePoint *pSamplePts_local;
  ON_3dPoint *pPts_local;
  int count_local;
  CMeshClosestPointMapper *this_local;
  
  ON_BoundingBox::ON_BoundingBox((ON_BoundingBox *)&commonFis.m_count);
  ON_SimpleArray<int>::ON_SimpleArray((ON_SimpleArray<int> *)&allFis.m_count);
  ON_SimpleArray<int>::ON_SimpleArray((ON_SimpleArray<int> *)local_b0);
  for (local_b4 = 0; local_b4 < count; local_b4 = local_b4 + 1) {
    ON_BoundingBox::Set((ON_BoundingBox *)&commonFis.m_count,pPts + local_b4,1);
    newCommonFis._16_8_ = pPts[local_b4].x;
    ON_SimpleArray<int>::SetCount(&this->m_resFis,0);
    ON_RTree::Search(this->m_pMeshFaceTree,(ON_RTreeSphere *)&newCommonFis.m_count,RTreeCallback,
                     this);
    if (local_b4 == 0) {
      ON_SimpleArray<int>::operator=((ON_SimpleArray<int> *)&allFis.m_count,&this->m_resFis);
    }
    else {
      iVar2 = ON_SimpleArray<int>::Count((ON_SimpleArray<int> *)&allFis.m_count);
      ON_SimpleArray<int>::ON_SimpleArray((ON_SimpleArray<int> *)&i_1,(long)iVar2);
      for (bestTol._4_4_ = 0;
          iVar2 = ON_SimpleArray<int>::Count((ON_SimpleArray<int> *)&allFis.m_count),
          bestTol._4_4_ < iVar2; bestTol._4_4_ = bestTol._4_4_ + 1) {
        piVar4 = ON_SimpleArray<int>::operator[]
                           ((ON_SimpleArray<int> *)&allFis.m_count,bestTol._4_4_);
        iVar2 = ON_SimpleArray<int>::Search(&this->m_resFis,piVar4);
        if (-1 < iVar2) {
          piVar4 = ON_SimpleArray<int>::operator[]
                             ((ON_SimpleArray<int> *)&allFis.m_count,bestTol._4_4_);
          ON_SimpleArray<int>::Append((ON_SimpleArray<int> *)&i_1,piVar4);
        }
      }
      ON_SimpleArray<int>::operator=
                ((ON_SimpleArray<int> *)&allFis.m_count,(ON_SimpleArray<int> *)&i_1);
      ON_SimpleArray<int>::~ON_SimpleArray((ON_SimpleArray<int> *)&i_1);
    }
    for (bestTol._0_4_ = 0; iVar2 = ON_SimpleArray<int>::Count(&this->m_resFis),
        bestTol._0_4_ < iVar2; bestTol._0_4_ = bestTol._0_4_ + 1) {
      piVar4 = ON_SimpleArray<int>::operator[](&this->m_resFis,bestTol._0_4_);
      AddIfNotIncluded((ON_SimpleArray<int> *)local_b0,*piVar4);
    }
  }
  if (bEqualFaceCheck) {
    bestTcs.super_ON_SimpleArray<ON_3dPoint>.m_count = -1;
    bestTcs.super_ON_SimpleArray<ON_3dPoint>.m_capacity = 0x7fefffff;
    ON_3dPointArray::ON_3dPointArray((ON_3dPointArray *)local_128,tcCount);
    for (tol._4_4_ = 0; iVar2 = tol._4_4_,
        iVar3 = ON_SimpleArray<int>::Count((ON_SimpleArray<int> *)&allFis.m_count), iVar2 < iVar3;
        tol._4_4_ = tol._4_4_ + 1) {
      _pi = 0.0;
      mesh = this->m_mesh;
      tcs = this->m_tc;
      piVar4 = ON_SimpleArray<int>::operator[]((ON_SimpleArray<int> *)&allFis.m_count,tol._4_4_);
      bVar1 = MatchFace(mesh,tcs,*piVar4,mappingTol,tcCount,pPts,pTcsOut,(double *)&pi);
      if (bVar1) {
        if ((_pi == 0.0) && (!NAN(_pi))) {
          this_local._7_1_ = 1;
          iStack_13c = 1;
          goto LAB_006db031;
        }
        if (_pi < (double)bestTcs.super_ON_SimpleArray<ON_3dPoint>._16_8_) {
          ON_SimpleArray<ON_3dPoint>::SetCount((ON_SimpleArray<ON_3dPoint> *)local_128,0);
          ON_SimpleArray<ON_3dPoint>::Append
                    ((ON_SimpleArray<ON_3dPoint> *)local_128,tcCount,pTcsOut);
          bestTcs.super_ON_SimpleArray<ON_3dPoint>._16_8_ = _pi;
        }
      }
    }
    if (mappingTol <= (double)bestTcs.super_ON_SimpleArray<ON_3dPoint>._16_8_) {
      iStack_13c = 0;
    }
    else {
      for (local_140 = 0; local_140 < tcCount; local_140 = local_140 + 1) {
        pOVar5 = ON_SimpleArray<ON_3dPoint>::operator[]
                           ((ON_SimpleArray<ON_3dPoint> *)local_128,local_140);
        pOVar6 = pTcsOut + local_140;
        pOVar6->x = pOVar5->x;
        pOVar6->y = pOVar5->y;
        pOVar6->z = pOVar5->z;
      }
      this_local._7_1_ = 1;
      iStack_13c = 1;
    }
LAB_006db031:
    ON_3dPointArray::~ON_3dPointArray((ON_3dPointArray *)local_128);
    if (iStack_13c != 0) goto LAB_006db350;
  }
  iVar2 = ON_SimpleArray<int>::Count((ON_SimpleArray<int> *)&allFis.m_count);
  if (iVar2 < 1) {
    maxDist_1._7_1_ = 0;
    dStack_170 = mappingTol;
    for (sp_1._4_4_ = 0; iVar2 = ON_SimpleArray<int>::Count((ON_SimpleArray<int> *)local_b0),
        sp_1._4_4_ < iVar2; sp_1._4_4_ = sp_1._4_4_ + 1) {
      piVar4 = ON_SimpleArray<int>::operator[]((ON_SimpleArray<int> *)local_b0,sp_1._4_4_);
      this_00 = TcSeamlessPatchCache::Get(patchCache,*piVar4);
      pOVar7 = TcSeamlessPatch::BBox(this_00);
      auStack_1b8 = (undefined1  [8])(pOVar7->m_min).x;
      patchMaxDistBb.m_min.x = (pOVar7->m_min).y;
      patchMaxDistBb.m_min.y = (pOVar7->m_min).z;
      patchMaxDistBb.m_min.z = (pOVar7->m_max).x;
      patchMaxDistBb.m_max.x = (pOVar7->m_max).y;
      patchMaxDistBb.m_max.y = (pOVar7->m_max).z;
      ON_3dVector::ON_3dVector(&local_1d0,dStack_170,dStack_170,dStack_170);
      delta.y = local_1d0.y;
      delta.x = local_1d0.x;
      delta.z = local_1d0.z;
      ON_BoundingBox::Expand((ON_BoundingBox *)auStack_1b8,delta);
      bVar1 = ON_BoundingBox::Includes
                        ((ON_BoundingBox *)auStack_1b8,(ON_BoundingBox *)&commonFis.m_count,false);
      if ((bVar1) &&
         (bVar1 = TcSeamlessPatch::Evaluate
                            (this_00,count,pSamplePts,&stack0xfffffffffffffe90,tcCount,pTcsOut),
         bVar1)) {
        maxDist_1._7_1_ = 1;
      }
    }
    if ((maxDist_1._7_1_ & 1) != 0) {
      this_local._7_1_ = 1;
      iStack_13c = 1;
      goto LAB_006db350;
    }
  }
  else {
    maxDist._7_1_ = 0;
    dStack_150 = mappingTol;
    for (sp._4_4_ = 0; iVar2 = sp._4_4_,
        iVar3 = ON_SimpleArray<int>::Count((ON_SimpleArray<int> *)&allFis.m_count), iVar2 < iVar3;
        sp._4_4_ = sp._4_4_ + 1) {
      piVar4 = ON_SimpleArray<int>::operator[]((ON_SimpleArray<int> *)&allFis.m_count,sp._4_4_);
      pTStack_160 = TcSeamlessPatchCache::Get(patchCache,*piVar4);
      bVar1 = TcSeamlessPatch::Evaluate
                        (pTStack_160,count,pSamplePts,&stack0xfffffffffffffeb0,tcCount,pTcsOut);
      if (bVar1) {
        maxDist._7_1_ = 1;
      }
    }
    if ((maxDist._7_1_ & 1) != 0) {
      this_local._7_1_ = 1;
      iStack_13c = 1;
      goto LAB_006db350;
    }
  }
  this_local._7_1_ = 0;
  iStack_13c = 1;
LAB_006db350:
  ON_SimpleArray<int>::~ON_SimpleArray((ON_SimpleArray<int> *)local_b0);
  ON_SimpleArray<int>::~ON_SimpleArray((ON_SimpleArray<int> *)&allFis.m_count);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool AdaptedMatchFaceTC(int count, const ON_3dPoint* pPts, SamplePoint* pSamplePts, int tcCount, ON_3dPoint* pTcsOut, double mappingTol, bool bEqualFaceCheck, TcSeamlessPatchCache& patchCache) const
	{
		// This code is dummy iteration through all faces to find a matching one
		//double minTol = DBL_MAX;
		//double matchTol = DBL_MAX;
		//int matchFi = -1;
		//for (int fi = 0; fi < m_mesh.m_F.Count(); fi++)
		//{
		//  double tol = 0.0;
		//  if (MatchFace(m_mesh, m_tc, fi, mappingTol, count, pPts, pTcsOut, tol))
		//  {
		//    if (tol < matchTol)
		//    {
		//      matchFi = fi;
		//      matchTol = tol;
		//    }
		//    //return true; // Uncomment this to return here
		//  }
		//  if (tol < minTol)
		//  {
		//    minTol = tol;
		//  }
		//}

		ON_BoundingBox samplePointBbox;
		ON_SimpleArray<int> commonFis;
		ON_SimpleArray<int> allFis;
		for (int fvi = 0; fvi < count; fvi++)
		{
			samplePointBbox.Set(pPts[fvi], 1);
			ON_RTreeSphere sphere;
			sphere.m_point[0] = pPts[fvi].x;
			sphere.m_point[1] = pPts[fvi].y;
			sphere.m_point[2] = pPts[fvi].z;
			sphere.m_radius = mappingTol;
			m_resFis.SetCount(0);
			m_pMeshFaceTree->Search(&sphere, RTreeCallback, (void*)this);
			if (fvi == 0)
			{
				commonFis = m_resFis;
			}
			else
			{
				ON_SimpleArray<int> newCommonFis(commonFis.Count());
				for (int i = 0; i < commonFis.Count(); i++)
				{
					if (m_resFis.Search(commonFis[i]) >= 0)
						newCommonFis.Append(commonFis[i]);
				}
				commonFis = newCommonFis;
			}
			for (int i = 0; i < m_resFis.Count(); i++)
				AddIfNotIncluded(allFis, m_resFis[i]);
		}

    if (bEqualFaceCheck)
    {
      double bestTol = DBL_MAX;
      ON_3dPointArray bestTcs(tcCount);
      for (int i = 0; i < commonFis.Count(); i++)
      {
        double tol = 0.0;
        if (MatchFace(m_mesh, m_tc, commonFis[i], mappingTol, tcCount, pPts, pTcsOut, tol))
        {
          if (tol == 0.0)
          {
            return true;
          }
          else if (tol < bestTol)
          {
            bestTcs.SetCount(0);
            bestTcs.Append(tcCount, pTcsOut);
            bestTol = tol;
          }
        }
      }
      if (bestTol < mappingTol)
      {
        for (int pi = 0; pi < tcCount; pi++)
        {
          pTcsOut[pi] = bestTcs[pi];
        }
        return true;
      }
    }

    if (commonFis.Count() > 0)
    {
      bool bSuccess = false;
      double maxDist = mappingTol;
      for (int i = 0; i < commonFis.Count(); i++)
      {
        const TcSeamlessPatch& sp = patchCache.Get(commonFis[i]);
        if (sp.Evaluate(count, pSamplePts, maxDist, tcCount, pTcsOut))
        {
          bSuccess = true;
        }
      }
      if (bSuccess)
        return true;
    }
    else
    {
      bool bSuccess = false;
      double maxDist = mappingTol;
      for (int i = 0; i < allFis.Count(); i++)
      {
        const TcSeamlessPatch& sp = patchCache.Get(allFis[i]);
        ON_BoundingBox patchMaxDistBb(sp.BBox());
        patchMaxDistBb.Expand(ON_3dVector(maxDist, maxDist, maxDist));
        if (patchMaxDistBb.Includes(samplePointBbox))
        {
          if (sp.Evaluate(count, pSamplePts, maxDist, tcCount, pTcsOut))
          {
            bSuccess = true;
          }
        }
      }
      if (bSuccess)
        return true;
    }


		return false;
	}